

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxCVar::Emit(FxCVar *this,VMFunctionBuilder *build)

{
  byte bVar1;
  FBaseCVar *pFVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  bVar1 = ((this->super_FxExpression).ValueType)->RegType;
  uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,1);
  uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
  uVar5 = VMFunctionBuilder::GetConstantInt(build,0);
  iVar6 = (*this->CVar->_vptr_FBaseCVar[2])();
  switch(iVar6) {
  case 0:
    uVar7 = VMFunctionBuilder::GetConstantAddress(build,this->CVar + 1,'\0');
    VMFunctionBuilder::Emit(build,5,uVar4 & 0xffff,(VM_SHALF)uVar7);
    iVar6 = 0x12;
    break;
  case 1:
  case 4:
    uVar7 = VMFunctionBuilder::GetConstantAddress(build,this->CVar + 1,'\0');
    VMFunctionBuilder::Emit(build,5,uVar4 & 0xffff,(VM_SHALF)uVar7);
    iVar6 = 0x10;
    break;
  case 2:
    uVar7 = VMFunctionBuilder::GetConstantAddress(build,this->CVar + 1,'\0');
    VMFunctionBuilder::Emit(build,5,uVar4 & 0xffff,(VM_SHALF)uVar7);
    iVar6 = 0x16;
    break;
  case 3:
    uVar7 = VMFunctionBuilder::GetConstantAddress(build,this->CVar + 1,'\0');
    VMFunctionBuilder::Emit(build,5,uVar4 & 0xffff,(VM_SHALF)uVar7);
    iVar6 = 0x1a;
    break;
  case 5:
    pFVar2 = this->CVar;
    uVar7 = VMFunctionBuilder::GetConstantAddress(build,pFVar2[1]._vptr_FBaseCVar + 5,'\0');
    VMFunctionBuilder::Emit(build,5,uVar4 & 0xffff,(VM_SHALF)uVar7);
    uVar7 = uVar3 & 0xffff;
    VMFunctionBuilder::Emit(build,0x10,uVar7,uVar4 & 0xffff,uVar5);
    VMFunctionBuilder::Emit(build,0x5e,uVar7,uVar7,*(int *)((long)&pFVar2[1].Name + 4));
    uVar5 = VMFunctionBuilder::GetConstantInt(build,1);
    iVar6 = 0x78;
    goto LAB_00530328;
  case 6:
    pFVar2 = this->CVar;
    uVar7 = VMFunctionBuilder::GetConstantAddress(build,pFVar2[1]._vptr_FBaseCVar + 5,'\0');
    VMFunctionBuilder::Emit(build,5,uVar4 & 0xffff,(VM_SHALF)uVar7);
    uVar7 = uVar3 & 0xffff;
    VMFunctionBuilder::Emit(build,0x10,uVar7,uVar4 & 0xffff,uVar5);
    uVar5 = VMFunctionBuilder::GetConstantInt(build,*(int *)&pFVar2[1].Name);
    VMFunctionBuilder::Emit(build,0x78,uVar7,uVar7,uVar5);
    uVar5 = *(uint *)((long)&pFVar2[1].Name + 4);
    iVar6 = 0x5e;
    goto LAB_00530328;
  default:
    __assert_fail("false && \"Unsupported CVar type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x187e,"virtual ExpEmit FxCVar::Emit(VMFunctionBuilder *)");
  }
  uVar7 = uVar4 & 0xffff;
LAB_00530328:
  VMFunctionBuilder::Emit(build,iVar6,uVar3 & 0xffff,uVar7,uVar5);
  VMFunctionBuilder::RegAvailability::Return(build->Registers + 3,uVar4 & 0xffff,1);
  return (ExpEmit)((ulong)((uint)bVar1 << 0x10 | uVar3 & 0xffff) | 0x1000000);
}

Assistant:

ExpEmit FxCVar::Emit(VMFunctionBuilder *build)
{
	ExpEmit dest(build, ValueType->GetRegType());
	ExpEmit addr(build, REGT_POINTER);
	int nul = build->GetConstantInt(0);
	switch (CVar->GetRealType())
	{
	case CVAR_Int:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FIntCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LW, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_Color:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FColorCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LW, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_Float:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FFloatCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LSP, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_Bool:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FBoolCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LBU, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_String:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FStringCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LS, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_DummyBool:
	{
		auto cv = static_cast<FFlagCVar *>(CVar);
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&cv->ValueVar.Value, ATAG_GENERIC));
		build->Emit(OP_LW, dest.RegNum, addr.RegNum, nul);
		build->Emit(OP_SRL_RI, dest.RegNum, dest.RegNum, cv->BitNum);
		build->Emit(OP_AND_RK, dest.RegNum, dest.RegNum, build->GetConstantInt(1));
		break;
	}

	case CVAR_DummyInt:
	{
		auto cv = static_cast<FMaskCVar *>(CVar);
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&cv->ValueVar.Value, ATAG_GENERIC));
		build->Emit(OP_LW, dest.RegNum, addr.RegNum, nul);
		build->Emit(OP_AND_RK, dest.RegNum, dest.RegNum, build->GetConstantInt(cv->BitVal));
		build->Emit(OP_SRL_RI, dest.RegNum, dest.RegNum, cv->BitNum);
		break;
	}

	default:
		assert(false && "Unsupported CVar type");
		break;
	}
	addr.Free(build);
	return dest;
}